

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O0

int run_test_fs_event_getpath(void)

{
  char *pcVar1;
  int iVar2;
  uv_loop_t *puVar3;
  size_t sVar4;
  char *pcVar5;
  undefined8 local_448;
  char *watch_dir [5];
  size_t len;
  char buf [1024];
  int r;
  uint i;
  uv_loop_t *loop;
  
  puVar3 = uv_default_loop();
  memcpy(&local_448,&DAT_001efca0,0x28);
  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");
  buf[0x3fc] = '\0';
  buf[0x3fd] = '\0';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  while( true ) {
    if (4 < (uint)buf._1020_4_) {
      remove("watch_dir/");
      puVar3 = uv_default_loop();
      close_loop(puVar3);
      puVar3 = uv_default_loop();
      iVar2 = uv_loop_close(puVar3);
      if (iVar2 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-event.c"
                ,0x41d,"0 == uv_loop_close(uv_default_loop())");
        abort();
      }
      uv_library_shutdown();
      return 0;
    }
    buf._1016_4_ = uv_fs_event_init(puVar3,&fs_event);
    if (buf._1016_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-event.c"
              ,0x403,"r == 0");
      abort();
    }
    watch_dir[4] = (char *)0x400;
    iVar2 = uv_fs_event_getpath(&fs_event,(char *)&len,(size_t *)(watch_dir + 4));
    buf[0x3f8] = (char)iVar2;
    buf[0x3f9] = (char)((uint)iVar2 >> 8);
    buf[0x3fa] = (char)((uint)iVar2 >> 0x10);
    buf[0x3fb] = (char)((uint)iVar2 >> 0x18);
    if (iVar2 != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-event.c"
              ,0x406,"r == UV_EINVAL");
      abort();
    }
    buf._1016_4_ = uv_fs_event_start(&fs_event,fail_cb,watch_dir[(ulong)(uint)buf._1020_4_ - 1],0);
    if (buf._1016_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-event.c"
              ,0x408,"r == 0");
      abort();
    }
    watch_dir[4] = (char *)0x0;
    iVar2 = uv_fs_event_getpath(&fs_event,(char *)&len,(size_t *)(watch_dir + 4));
    pcVar1 = watch_dir[4];
    buf[0x3f8] = (char)iVar2;
    buf[0x3f9] = (char)((uint)iVar2 >> 8);
    buf[0x3fa] = (char)((uint)iVar2 >> 0x10);
    buf[0x3fb] = (char)((uint)iVar2 >> 0x18);
    if (iVar2 != -0x69) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-event.c"
              ,0x40b,"r == UV_ENOBUFS");
      abort();
    }
    if ((char *)0x3ff < watch_dir[4]) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-event.c"
              ,0x40c,"len < sizeof buf");
      abort();
    }
    sVar4 = strlen(watch_dir[(ulong)(uint)buf._1020_4_ - 1]);
    if (pcVar1 != (char *)(sVar4 + 1)) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-event.c"
              ,0x40d,"len == strlen(watch_dir[i]) + 1");
      abort();
    }
    iVar2 = uv_fs_event_getpath(&fs_event,(char *)&len,(size_t *)(watch_dir + 4));
    pcVar1 = watch_dir[4];
    buf[0x3f8] = (char)iVar2;
    buf[0x3f9] = (char)((uint)iVar2 >> 8);
    buf[0x3fa] = (char)((uint)iVar2 >> 0x10);
    buf[0x3fb] = (char)((uint)iVar2 >> 0x18);
    if (iVar2 != 0) break;
    pcVar5 = (char *)strlen(watch_dir[(ulong)(uint)buf._1020_4_ - 1]);
    if (pcVar1 != pcVar5) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-event.c"
              ,0x410,"len == strlen(watch_dir[i])");
      abort();
    }
    iVar2 = strcmp((char *)&len,watch_dir[(ulong)(uint)buf._1020_4_ - 1]);
    if (iVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-event.c"
              ,0x411,"strcmp(buf, watch_dir[i]) == 0");
      abort();
    }
    buf._1016_4_ = uv_fs_event_stop(&fs_event);
    if (buf._1016_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-event.c"
              ,0x413,"r == 0");
      abort();
    }
    uv_close((uv_handle_t *)&fs_event,close_cb);
    uv_run(puVar3,UV_RUN_DEFAULT);
    if (close_cb_called != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-event.c"
              ,0x418,"close_cb_called == 1");
      abort();
    }
    close_cb_called = 0;
    buf._1020_4_ = buf._1020_4_ + 1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-event.c"
          ,0x40f,"r == 0");
  abort();
}

Assistant:

TEST_IMPL(fs_event_getpath) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_loop_t* loop = uv_default_loop();
  unsigned i;
  int r;
  char buf[1024];
  size_t len;
  const char* const watch_dir[] = {
    "watch_dir",
    "watch_dir/",
    "watch_dir///",
    "watch_dir/subfolder/..",
    "watch_dir//subfolder//..//",
  };

  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");


  for (i = 0; i < ARRAY_SIZE(watch_dir); i++) {
    r = uv_fs_event_init(loop, &fs_event);
    ASSERT(r == 0);
    len = sizeof buf;
    r = uv_fs_event_getpath(&fs_event, buf, &len);
    ASSERT(r == UV_EINVAL);
    r = uv_fs_event_start(&fs_event, fail_cb, watch_dir[i], 0);
    ASSERT(r == 0);
    len = 0;
    r = uv_fs_event_getpath(&fs_event, buf, &len);
    ASSERT(r == UV_ENOBUFS);
    ASSERT(len < sizeof buf); /* sanity check */
    ASSERT(len == strlen(watch_dir[i]) + 1);
    r = uv_fs_event_getpath(&fs_event, buf, &len);
    ASSERT(r == 0);
    ASSERT(len == strlen(watch_dir[i]));
    ASSERT(strcmp(buf, watch_dir[i]) == 0);
    r = uv_fs_event_stop(&fs_event);
    ASSERT(r == 0);
    uv_close((uv_handle_t*) &fs_event, close_cb);

    uv_run(loop, UV_RUN_DEFAULT);

    ASSERT(close_cb_called == 1);
    close_cb_called = 0;
  }

  remove("watch_dir/");
  MAKE_VALGRIND_HAPPY();
  return 0;
}